

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OgreXmlSerializer.cpp
# Opt level: O2

string * __thiscall
Assimp::Ogre::OgreXmlSerializer::SkipCurrentNode_abi_cxx11_(OgreXmlSerializer *this)

{
  __type _Var1;
  int iVar2;
  undefined4 extraout_var;
  string *psVar3;
  allocator<char> local_49;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_48;
  
  psVar3 = &this->m_currentNodeName;
  do {
    do {
      iVar2 = (*this->m_reader->_vptr_IIrrXMLReader[2])();
      if ((char)iVar2 == '\0') {
        std::__cxx11::string::assign((char *)psVar3);
        return psVar3;
      }
      iVar2 = (*this->m_reader->_vptr_IIrrXMLReader[3])();
    } while (iVar2 != 2);
    iVar2 = (*this->m_reader->_vptr_IIrrXMLReader[0xd])();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_48,(char *)CONCAT44(extraout_var,iVar2),&local_49);
    _Var1 = std::operator==(&local_48,psVar3);
    std::__cxx11::string::~string((string *)&local_48);
  } while (!_Var1);
  psVar3 = NextNode_abi_cxx11_(this);
  return psVar3;
}

Assistant:

std::string &OgreXmlSerializer::SkipCurrentNode()
{
#if (OGRE_XML_SERIALIZER_DEBUG == 1)
    ASSIMP_LOG_DEBUG("Skipping node <" + m_currentNodeName + ">");
#endif

    for(;;) {
        if (!m_reader->read()) {
            m_currentNodeName = "";
            return m_currentNodeName;
        }
        if ( m_reader->getNodeType() != irr::io::EXN_ELEMENT_END ) {
            continue;
        } else if ( std::string( m_reader->getNodeName() ) == m_currentNodeName ) {
            break;
        }
    }

    return NextNode();
}